

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_call.hpp
# Opt level: O1

void squall::detail::call_setup<int,int,int,int>
               (HSQUIRRELVM vm,HSQOBJECT *table,string *name,int args,int args_1,int args_2,
               int args_3)

{
  SQRESULT SVar1;
  runtime_error *prVar2;
  HSQOBJECT obj;
  HSQOBJECT obj_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  obj._4_4_ = 0;
  obj._type = table->_type;
  obj._unVal.pTable = (table->_unVal).pTable;
  sq_pushobject(vm,obj);
  sq_pushstring(vm,(name->_M_dataplus)._M_p,name->_M_string_length);
  SVar1 = sq_get(vm,-2);
  if (SVar1 < 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"can\'t find such function: ",name);
    std::runtime_error::runtime_error(prVar2,(string *)&local_50);
    *(undefined ***)prVar2 = &PTR__runtime_error_0013c478;
    __cxa_throw(prVar2,&squirrel_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sq_remove(vm,-2);
  obj_00._4_4_ = 0;
  obj_00._type = table->_type;
  obj_00._unVal.pTable = (table->_unVal).pTable;
  sq_pushobject(vm,obj_00);
  sq_pushinteger(vm,(long)args);
  sq_pushinteger(vm,(long)args_1);
  sq_pushinteger(vm,(long)args_2);
  sq_pushinteger(vm,(long)args_3);
  SVar1 = sq_call(vm,5,1,1);
  if (-1 < SVar1) {
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"function call failed: ",name);
  std::runtime_error::runtime_error(prVar2,(string *)&local_50);
  *(undefined ***)prVar2 = &PTR__runtime_error_0013c478;
  __cxa_throw(prVar2,&squirrel_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
void call_setup(HSQUIRRELVM vm, const HSQOBJECT& table,
                const string& name, T... args) {

    sq_pushobject(vm, table);
    sq_pushstring(vm, name.data(), name.length());
    if (!SQ_SUCCEEDED(sq_get(vm, -2))) {
        throw squirrel_error(_SC("can't find such function: ") + name);
    }

    sq_remove(vm, -2);
    sq_pushobject(vm, table);
    call_setup_arg(vm, args...);
    if (!SQ_SUCCEEDED(sq_call(vm, sizeof...(args)+1, SQTrue, SQTrue))) {
        throw squirrel_error(_SC("function call failed: ") + name);
    }
}